

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O0

void clear_args(gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_local;
  
  args_info->input_arg = (char *)0x0;
  args_info->input_orig = (char *)0x0;
  args_info->box_flag = 0;
  args_info->method_arg = (char *)0x0;
  args_info->method_orig = (char *)0x0;
  args_info->npoints_arg = 0x19;
  args_info->npoints_orig = (char *)0x0;
  args_info->delta_orig = (char *)0x0;
  return;
}

Assistant:

static
void clear_args (struct gengetopt_args_info *args_info)
{
  FIX_UNUSED (args_info);
  args_info->input_arg = NULL;
  args_info->input_orig = NULL;
  args_info->box_flag = 0;
  args_info->method_arg = NULL;
  args_info->method_orig = NULL;
  args_info->npoints_arg = 25;
  args_info->npoints_orig = NULL;
  args_info->delta_orig = NULL;
  
}